

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptSaveInt(int *arg,uint argInfo,long aLong)

{
  uint uVar1;
  longlong lVar2;
  long local_28;
  long aLong_local;
  uint argInfo_local;
  int *arg_local;
  
  if ((arg == (int *)0x0) || (((ulong)arg & 3) != 0)) {
    arg_local._4_4_ = -0x14;
  }
  else {
    local_28 = aLong;
    if ((aLong != 0) && ((argInfo & 0x400000) != 0)) {
      lVar2 = poptRandomValue(aLong);
      local_28 = (long)(int)lVar2;
      if (local_28 < 0) {
        return (int)lVar2;
      }
    }
    if ((argInfo & 0x1000000) != 0) {
      local_28._0_4_ = (uint)local_28 ^ 0xffffffff;
    }
    uVar1 = argInfo & 0xe000000;
    if (uVar1 == 0) {
      *arg = (uint)local_28;
    }
    else if (uVar1 == 0x2000000) {
      *arg = (uint)local_28 ^ *arg;
    }
    else if (uVar1 == 0x4000000) {
      *arg = (uint)local_28 & *arg;
    }
    else {
      if (uVar1 != 0x8000000) {
        return -0x13;
      }
      *arg = (uint)local_28 | *arg;
    }
    arg_local._4_4_ = 0;
  }
  return arg_local._4_4_;
}

Assistant:

int poptSaveInt(int * arg, unsigned int argInfo, long aLong)
{
    /* XXX Check alignment, may fail on funky platforms. */
    if (arg == NULL || (((unsigned long)arg) & (ALIGNOF(*arg)-1)))
	return POPT_ERROR_NULLARG;

    if (aLong != 0 && LF_ISSET(RANDOM)) {
	aLong = (int)poptRandomValue(aLong);
	if (aLong < 0)
	    return aLong;
    }
    if (LF_ISSET(NOT))
	aLong = ~aLong;
    switch (LF_ISSET(LOGICALOPS)) {
    case 0:		   *arg = (int) aLong;				break;
    case POPT_ARGFLAG_OR:  *(unsigned int *)arg |= (unsigned int) aLong; break;
    case POPT_ARGFLAG_AND: *(unsigned int *)arg &= (unsigned int) aLong; break;
    case POPT_ARGFLAG_XOR: *(unsigned int *)arg ^= (unsigned int) aLong; break;
    default:
	return POPT_ERROR_BADOPERATION;
	break;
    }
    return 0;
}